

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

int __thiscall
cppcms::widgets::select::~select
          (select *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  _data *p_Var1;
  int extraout_EAX;
  
  (this->super_select_base).super_base_widget.super_base_form._vptr_base_form =
       (_func_int **)&PTR_render_0028a1a8;
  p_Var1 = (this->d).ptr_;
  if (p_Var1 != (_data *)0x0) {
    operator_delete(p_Var1);
  }
  select_base::~select_base(&this->super_select_base);
  return extraout_EAX;
}

Assistant:

void select::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		out<<"<select ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(int(i) == selected()) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}